

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Sort.h
# Opt level: O0

void Minisat::mergesort<Minisat::Option*,Minisat::Option::OptionLt>(void *param_1,int param_2)

{
  undefined1 auVar1 [16];
  bool bVar2;
  void *pvVar3;
  bool bVar4;
  int iVar5;
  ulong uVar6;
  Option **tmp_1;
  Option **tmp;
  int left;
  int windowSize;
  int writeHead;
  int rightRead;
  int leftRead;
  int rightEnd;
  int rightHead;
  int swaps;
  Option **helpArray;
  Option *in_stack_ffffffffffffffa0;
  undefined7 in_stack_ffffffffffffffa8;
  OptionLt *in_stack_ffffffffffffffb0;
  int local_40;
  int local_3c;
  int local_38;
  int local_34;
  int local_30;
  int local_2c;
  void *local_20;
  void *local_10;
  
  auVar1._8_8_ = 0;
  auVar1._0_8_ = (long)param_2;
  uVar6 = SUB168(auVar1 * ZEXT816(8),0);
  if (SUB168(auVar1 * ZEXT816(8),8) != 0) {
    uVar6 = 0xffffffffffffffff;
  }
  local_20 = operator_new__(uVar6);
  bVar2 = false;
  local_38 = 0;
  local_10 = param_1;
  for (local_3c = 1; pvVar3 = local_10, local_3c < param_2; local_3c = local_3c << 1) {
    for (local_40 = 0; local_40 + local_3c < param_2; local_40 = local_3c * 2 + local_40) {
      iVar5 = local_40 + local_3c;
      local_2c = iVar5 + local_3c;
      if (param_2 < local_2c) {
        local_2c = param_2;
      }
      local_38 = local_40;
      local_30 = local_40;
      local_34 = iVar5;
      while (local_30 < iVar5 && local_34 < local_2c) {
        bVar4 = Option::OptionLt::operator()
                          (in_stack_ffffffffffffffb0,
                           (Option *)
                           CONCAT17(local_30 < iVar5 && local_34 < local_2c,
                                    in_stack_ffffffffffffffa8),in_stack_ffffffffffffffa0);
        if (bVar4) {
          *(undefined8 *)((long)local_20 + (long)local_38 * 8) =
               *(undefined8 *)((long)local_10 + (long)local_30 * 8);
          local_30 = local_30 + 1;
        }
        else {
          *(undefined8 *)((long)local_20 + (long)local_38 * 8) =
               *(undefined8 *)((long)local_10 + (long)local_34 * 8);
          local_34 = local_34 + 1;
        }
        local_38 = local_38 + 1;
      }
      while (local_30 < iVar5) {
        *(undefined8 *)((long)local_20 + (long)local_38 * 8) =
             *(undefined8 *)((long)local_10 + (long)local_30 * 8);
        local_38 = local_38 + 1;
        local_30 = local_30 + 1;
      }
      while (local_34 < local_2c) {
        *(undefined8 *)((long)local_20 + (long)local_38 * 8) =
             *(undefined8 *)((long)local_10 + (long)local_34 * 8);
        local_38 = local_38 + 1;
        local_34 = local_34 + 1;
      }
    }
    for (; local_38 < param_2; local_38 = local_38 + 1) {
      *(undefined8 *)((long)local_20 + (long)local_38 * 8) =
           *(undefined8 *)((long)local_10 + (long)local_38 * 8);
    }
    local_10 = local_20;
    local_20 = pvVar3;
    bVar2 = (bool)(bVar2 ^ 1);
  }
  if (bVar2) {
    memcpy(local_20,local_10,(long)param_2 << 3);
    local_20 = local_10;
  }
  if (local_20 != (void *)0x0) {
    operator_delete__(local_20);
  }
  return;
}

Assistant:

static inline void mergesort(T *field, const int32_t arraySize, LessThan lt)
{
    // if copying is enabled, only half of the elements are needed
    T *helpArray = new T[arraySize];
    int swaps = 0;

    int rightHead, rightEnd;
    int leftRead, rightRead, writeHead = 0;

    for (int windowSize = 1; windowSize < arraySize; windowSize *= 2) {
        for (int left = 0; left + windowSize < arraySize; left += windowSize * 2) {
            rightHead = left + windowSize;
            rightEnd = rightHead + windowSize;
            if (rightEnd > arraySize) {
                rightEnd = arraySize;
            } // stay within the array!
            writeHead = left;
            leftRead = left;
            rightRead = rightHead;
            while (leftRead < rightHead && rightRead < rightEnd) { // merge the two fields by using the smaller number
                if (lt(field[leftRead], field[rightRead])) {       // use the smaller element
                    helpArray[writeHead++] = field[leftRead++];
                } else {
                    helpArray[writeHead++] = field[rightRead++];
                }
            }
            // write the remaining positions from the one field that is left
            while (leftRead < rightHead) {
                helpArray[writeHead++] = field[leftRead++];
            }
            while (rightRead < rightEnd) {
                helpArray[writeHead++] = field[rightRead++];
            }
        }
        while (writeHead < arraySize) {
            helpArray[writeHead] = field[writeHead];
            writeHead++;
        }
        // swap fields after the iteration (do not copy!)
        T *tmp = field;
        field = helpArray;
        helpArray = tmp;
        swaps++;
    }
    // copy back original data into original std::vector!
    if ((swaps & 1) != 0) {
        // std::cerr << "c swaps: " << swaps << std::endl;
        memcpy(helpArray, field, sizeof(T) * arraySize); // copy currently sorted data into the other std::vector as well, if necessary!
        T *tmp = field;
        helpArray = tmp;
    }
    // free space
    delete[] helpArray;
}